

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::AssertionPrinter
          (AssertionPrinter *this,ostream *_stream,AssertionStats *_stats,bool _printInfoMessages)

{
  bool bVar1;
  OfType OVar2;
  size_type sVar3;
  byte in_CL;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_RDX;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_RSI;
  undefined8 *in_RDI;
  AssertionResult *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = &(in_RDX->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
  *(undefined4 *)(in_RDI + 3) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::string::string((string *)(in_RDI + 8));
  AssertionResult::getMessage_abi_cxx11_(in_stack_ffffffffffffff98);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector(in_RSI,in_RDX);
  *(byte *)(in_RDI + 0x13) = in_CL & 1;
  OVar2 = AssertionResult::getResultType((AssertionResult *)in_RDI[2]);
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      *(undefined4 *)(in_RDI + 3) = 3;
      std::__cxx11::string::operator=((string *)(in_RDI + 4),"PASSED");
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size(in_RDX + 8)
      ;
      if (sVar3 == 1) {
        std::__cxx11::string::operator=((string *)(in_RDI + 8),"with message");
      }
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size(in_RDX + 8)
      ;
      if (sVar3 < 2) {
        return;
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 8),"with messages");
      return;
    }
    if (OVar2 == Info) {
      std::__cxx11::string::operator=((string *)(in_RDI + 8),"info");
      return;
    }
    if (OVar2 == Warning) {
      std::__cxx11::string::operator=((string *)(in_RDI + 8),"warning");
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk((AssertionResult *)CONCAT44(0x11,in_stack_ffffffffffffffa0));
        if (bVar1) {
          *(undefined4 *)(in_RDI + 3) = 3;
          std::__cxx11::string::operator=((string *)(in_RDI + 4),"FAILED - but was ok");
        }
        else {
          *(undefined4 *)(in_RDI + 3) = 0x12;
          std::__cxx11::string::operator=((string *)(in_RDI + 4),"FAILED");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (in_RDX + 8);
        if (sVar3 == 1) {
          std::__cxx11::string::operator=((string *)(in_RDI + 8),"with message");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (in_RDX + 8);
        if (sVar3 < 2) {
          return;
        }
        std::__cxx11::string::operator=((string *)(in_RDI + 8),"with messages");
        return;
      }
      if (OVar2 == ExplicitFailure) {
        std::__cxx11::string::operator=((string *)(in_RDI + 4),"FAILED");
        *(undefined4 *)(in_RDI + 3) = 0x12;
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (in_RDX + 8);
        if (sVar3 == 1) {
          std::__cxx11::string::operator=((string *)(in_RDI + 8),"explicitly with message");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          (in_RDX + 8);
        if (sVar3 < 2) {
          return;
        }
        std::__cxx11::string::operator=((string *)(in_RDI + 8),"explicitly with messages");
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          *(undefined4 *)(in_RDI + 3) = 0x12;
          std::__cxx11::string::operator=((string *)(in_RDI + 4),"FAILED");
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 8),"due to unexpected exception with message");
          return;
        }
        if (OVar2 != DidntThrowException) {
          if (OVar2 != FatalErrorCondition) {
            return;
          }
          *(undefined4 *)(in_RDI + 3) = 0x12;
          std::__cxx11::string::operator=((string *)(in_RDI + 4),"FAILED");
          std::__cxx11::string::operator=((string *)(in_RDI + 8),"due to a fatal error condition");
          return;
        }
        *(undefined4 *)(in_RDI + 3) = 0x12;
        std::__cxx11::string::operator=((string *)(in_RDI + 4),"FAILED");
        std::__cxx11::string::operator=
                  ((string *)(in_RDI + 8),"because no exception was thrown where one was expected");
        return;
      }
    }
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 4),"** internal error **");
  *(undefined4 *)(in_RDI + 3) = 0x12;
  return;
}

Assistant:

AssertionPrinter( std::ostream& _stream, AssertionStats const& _stats, bool _printInfoMessages )
            :   stream( _stream ),
                stats( _stats ),
                result( _stats.assertionResult ),
                colour( Colour::None ),
                message( result.getMessage() ),
                messages( _stats.infoMessages ),
                printInfoMessages( _printInfoMessages )
            {
                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        colour = Colour::Success;
                        passOrFail = "PASSED";
                        //if( result.hasMessage() )
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() ) {
                            colour = Colour::Success;
                            passOrFail = "FAILED - but was ok";
                        }
                        else {
                            colour = Colour::Error;
                            passOrFail = "FAILED";
                        }
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ThrewException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to unexpected exception with message";
                        break;
                    case ResultWas::FatalErrorCondition:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to a fatal error condition";
                        break;
                    case ResultWas::DidntThrowException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "because no exception was thrown where one was expected";
                        break;
                    case ResultWas::Info:
                        messageLabel = "info";
                        break;
                    case ResultWas::Warning:
                        messageLabel = "warning";
                        break;
                    case ResultWas::ExplicitFailure:
                        passOrFail = "FAILED";
                        colour = Colour::Error;
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "explicitly with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "explicitly with messages";
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        passOrFail = "** internal error **";
                        colour = Colour::Error;
                        break;
                }
            }